

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

void MetaEnumClass(nodeclass *Class,array *List)

{
  uint uVar1;
  nodemeta *m;
  nodemeta *pnVar2;
  dataid Id;
  ulong local_20;
  
  if (Class->ParentClass != (nodeclass *)0x0) {
    MetaEnumClass(Class->ParentClass,List);
  }
  pnVar2 = Class->Meta;
  if (pnVar2 != (nodemeta *)0x0) {
    do {
      uVar1 = *(uint *)pnVar2;
      if ((char)uVar1 == '\x1f') {
        local_20 = (ulong)(uVar1 >> 8);
        ArrayAppend(List,&local_20,8,0x100);
      }
      else if ((uVar1 & 0xff) == 0) {
        return;
      }
      pnVar2 = pnVar2 + 1;
    } while( true );
  }
  return;
}

Assistant:

static NOINLINE void MetaEnumClass(const nodeclass* Class,array* List)
{
    if (Class->ParentClass)
        MetaEnumClass(Class->ParentClass,List);

    if (Class->Meta)
    {
        const nodemeta* m;
        for (m=Class->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
            if (m->Meta == META_PARAM_TYPE)
            {
                dataid Id = m->Id;
                ArrayAppend(List,&Id,sizeof(Id),256);
            }
    }
}